

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::start_adjacency_constraints_for(Proof *this,int p,int t)

{
  pointer pIVar1;
  ostream *poVar2;
  int in_EDX;
  int in_ESI;
  
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18115b);
  poVar2 = std::operator<<((ostream *)&pIVar1->field_0x50,"* adjacency ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2," maps to ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

auto Proof::start_adjacency_constraints_for(int p, int t) -> void
{
    _imp->model_stream << "* adjacency " << p << " maps to " << t << '\n';
}